

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

iterator __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,iterator pos,uchar *value)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar7;
  uchar *__src;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  int iVar9;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->_size;
  uVar5 = uVar1 - 0x1d;
  ppVar8 = *(prevector<28U,_unsigned_char,_unsigned_int,_int> **)&this->_union;
  uVar4 = uVar5;
  if (uVar1 < 0x1d) {
    uVar4 = uVar1;
  }
  uVar6 = 0x1c;
  if (uVar1 >= 0x1d) {
    uVar6 = (this->_union).indirect_contents.capacity;
  }
  uVar4 = uVar4 + 1;
  ppVar7 = ppVar8;
  uVar3 = uVar1;
  if (uVar6 < uVar4) {
    change_capacity(this,(uVar4 >> 1) + uVar4);
    uVar3 = this->_size;
    ppVar7 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (this->_union).indirect_contents.indirect;
    uVar5 = uVar3 - 0x1d;
  }
  if (uVar1 < 0x1d) {
    ppVar8 = this;
  }
  iVar9 = (int)pos.ptr - (int)ppVar8;
  if (uVar3 < 0x1d) {
    uVar5 = uVar3;
    ppVar7 = this;
  }
  __src = (uchar *)((long)&ppVar7->_union + (long)iVar9);
  memmove((ppVar7->_union).direct + iVar9 + 1,__src,(ulong)(uVar5 - iVar9));
  this->_size = this->_size + 1;
  (ppVar7->_union).direct[iVar9] = *value;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (iterator)__src;
}

Assistant:

iterator insert(iterator pos, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + 1;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size++;
        new(static_cast<void*>(ptr)) T(value);
        return iterator(ptr);
    }